

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,TPZVerySparseMatrix<std::complex<float>_> *A)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  complex<float> *pcVar5;
  pointer ppVar6;
  TPZBaseMatrix *in_RSI;
  TPZRegisterClassId *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  pair<long,_long> *key;
  complex<float> *p;
  const_iterator end;
  const_iterator it;
  int64_t size;
  TPZVerySparseMatrix<std::complex<float>_> *in_stack_ffffffffffffff28;
  _Self *p_Var7;
  _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
  *in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_> *this_00;
  int64_t in_stack_ffffffffffffff40;
  void **in_stack_ffffffffffffff48;
  TPZManVector<int,_5> *in_stack_ffffffffffffff50;
  complex<float> *local_a0;
  _Self local_48;
  _Self local_40;
  ulong local_38;
  undefined8 local_20;
  undefined8 local_18;
  TPZBaseMatrix *local_10;
  
  local_18 = 0;
  local_20 = 0x21;
  local_10 = in_RSI;
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<std::complex<float>>>(in_RDI,0x21);
  TPZBaseMatrix::Rows(local_10);
  TPZBaseMatrix::Cols(local_10);
  TPZMatrix<std::complex<float>_>::TPZMatrix
            ((TPZMatrix<std::complex<float>_> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023de238;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffff50,(int64_t)in_stack_ffffffffffffff48);
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0x70));
  uVar3 = *(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10);
  if (uVar3 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    local_38 = uVar3;
    pcVar5 = (complex<float> *)operator_new__(uVar4);
    if (uVar3 != 0) {
      local_a0 = pcVar5;
      do {
        std::complex<float>::complex(local_a0,0.0,0.0);
        local_a0 = local_a0 + 1;
      } while (local_a0 != pcVar5 + uVar3);
    }
    *(complex<float> **)(in_RDI + 0x20) = pcVar5;
    local_40._M_node =
         (_Base_ptr)TPZVerySparseMatrix<std::complex<float>_>::MapBegin(in_stack_ffffffffffffff28);
    local_48._M_node =
         (_Base_ptr)TPZVerySparseMatrix<std::complex<float>_>::MapEnd(in_stack_ffffffffffffff28);
    memset(*(void **)(in_RDI + 0x20),0,local_38 << 3);
    while (bVar2 = std::operator!=(&local_40,&local_48), bVar2) {
      p_Var7 = &local_40;
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
               ::operator->(in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff30 =
           (_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_> *
           )(ppVar6->first).first;
      this_00 = (_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
                 *)(ppVar6->first).second;
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
               ::operator->(in_stack_ffffffffffffff30);
      (**(code **)(*(long *)in_RDI + 0x118))
                (in_RDI,in_stack_ffffffffffffff30,this_00,&ppVar6->second,in_R8,in_R9,p_Var7);
      std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>::
      operator++(this_00,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    }
  }
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(TPZVerySparseMatrix <TVar> const & A)
: TPZRegisterClassId(&TPZFMatrix::ClassId),
TPZMatrix<TVar>( A.Rows(), A.Cols() ), fElem(0), fGiven(0), fSize(0) {
    
    int64_t size = this->fRow * this->fCol;
    if(!size) return;
    fElem = new TVar[ size ] ;
    
#ifdef PZDEBUG2
    if ( size && fElem == NULL ) Error( "Constructor <memory allocation error>." );
#endif
    
    typename std::map <std::pair<int64_t, int64_t>, TVar>::const_iterator it = A.MapBegin();
    typename std::map <std::pair<int64_t, int64_t>, TVar>::const_iterator end = A.MapEnd();
    
    TVar * p = fElem;
    memset((void *)p, 0, (size_t)size*sizeof(TVar));
    
    for (; it != end; it++) {
        const std::pair<int64_t, int64_t>& key = it->first;
        PutVal(key.first, key.second, it->second);
    }
    
}